

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

long duckdb::DecimalScaleDownOperator::Operation<long,long>
               (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  long lVar2;
  duckdb *this;
  undefined1 auVar3 [16];
  long result;
  long local_40;
  string local_38;
  
  lVar2 = input / (*(long *)((long)dataptr + 0x28) / 2);
  this = (duckdb *)((long)((lVar2 >> 0x3f | 1U) + lVar2) / 2);
  bVar1 = TryCast::Operation<long,long>((int64_t)this,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,long>(&local_38,this,auVar3._8_8_);
  InvalidInputException::InvalidInputException(auVar3._0_8_,&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}